

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

int Fl::has_check(Fl_Timeout_Handler cb,void *argp)

{
  _func_void_void_ptr *p_Var1;
  Check *t;
  Check **p;
  void *argp_local;
  Fl_Timeout_Handler cb_local;
  
  t = (Check *)&first_check;
  while( true ) {
    if (t->cb == (_func_void_void_ptr *)0x0) {
      return 0;
    }
    p_Var1 = t->cb;
    if ((*(Fl_Timeout_Handler *)p_Var1 == cb) && (*(void **)(p_Var1 + 8) == argp)) break;
    t = (Check *)(p_Var1 + 0x10);
  }
  return 1;
}

Assistant:

int Fl::has_check(Fl_Timeout_Handler cb, void *argp) {
  for (Check** p = &first_check; *p;) {
    Check* t = *p;
    if (t->cb == cb && t->arg == argp) {
      return 1;
    } else {
      p = &(t->next);
    }
  }
  return 0;
}